

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_decimal(void)

{
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  char *pcVar1;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  char *pcVar6;
  wchar16 *pwVar7;
  long lVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  Status myStatus;
  StrX local_258;
  Status myStatus_12;
  char lex_iv_1 [10];
  char lex_iv_2 [12];
  char data_rawstr_3 [6];
  char data_rawstr_7 [7];
  char data_canrep_7 [6];
  char data_canrep_5 [7];
  char data_canrep_4 [7];
  char data_canrep_2 [7];
  char data_rawstr_6 [9];
  char data_rawstr_5 [10];
  char data_rawstr_4 [10];
  char data_rawstr_2 [8];
  char lex_v_ran64_v_2 [25];
  char lex_v_ran64_v_1 [25];
  char data_rawstr_1 [13];
  char data_canrep_6 [8];
  char data_canrep_3 [8];
  char data_canrep_1 [8];
  char lex_v_ran64_iv_2 [25];
  char lex_v_ran64_iv_1 [25];
  char lex_v_ran_v_1 [14];
  undefined8 local_f0;
  undefined8 local_c8;
  undefined8 local_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  builtin_strncpy(lex_v_ran_v_1 + 8,"67  \n",6);
  builtin_strncpy(lex_v_ran_v_1,"  1234.5",8);
  builtin_strncpy(lex_v_ran64_v_1 + 0x10,"1615.999",9);
  builtin_strncpy(lex_v_ran64_v_1,"1844674407370955",0x10);
  builtin_strncpy(lex_v_ran64_v_2 + 0x10,"09551615",9);
  builtin_strncpy(lex_v_ran64_v_2,"999.184467440737",0x10);
  builtin_strncpy(lex_v_ran64_iv_1 + 0x10,"1616.999",9);
  builtin_strncpy(lex_v_ran64_iv_1,"1844674407370955",0x10);
  builtin_strncpy(lex_v_ran64_iv_2 + 0x10,"09551616",9);
  builtin_strncpy(lex_v_ran64_iv_2,"999.184467440737",0x10);
  builtin_strncpy(lex_iv_1,"12b34.456",10);
  builtin_strncpy(lex_iv_2,"1234.56.789",0xc);
  builtin_strncpy(data_rawstr_1 + 8,"5  \n",5);
  builtin_strncpy(data_rawstr_1,"  -123.4",8);
  builtin_strncpy(data_canrep_1,"-123.45",8);
  builtin_strncpy(data_rawstr_2,"+123.45",8);
  builtin_strncpy(data_canrep_2,"123.45",7);
  builtin_strncpy(data_rawstr_3,"12345",6);
  builtin_strncpy(data_canrep_3,"12345.0",8);
  builtin_strncpy(data_rawstr_4,"000123.45",10);
  builtin_strncpy(data_canrep_4,"123.45",7);
  builtin_strncpy(data_rawstr_5,"123.45000",10);
  builtin_strncpy(data_canrep_5,"123.45",7);
  builtin_strncpy(data_rawstr_6,"00.12345",9);
  builtin_strncpy(data_canrep_6,"0.12345",8);
  builtin_strncpy(data_rawstr_7,"123.00",7);
  builtin_strncpy(data_canrep_7,"123.0",6);
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_v_ran_v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x336,lex_v_ran_v_1,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_v_ran64_v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x337,lex_v_ran64_v_1,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_v_ran64_v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x338,lex_v_ran64_v_2,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_v_ran64_iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x339,lex_v_ran64_iv_1,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_v_ran64_iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x33a,lex_v_ran64_iv_2,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      pcVar1 = local_258.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x33d,lex_iv_1,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_00103a27;
    }
  }
  else {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x33d,lex_iv_1,local_258.fLocalForm,0);
LAB_00103a27:
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    if (myStatus == st_FOCA0002) goto LAB_00103b11;
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    pcVar1 = local_258.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x33e,lex_iv_2,pcVar1,"st_FOCA0002",pcVar6);
  }
  else {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x33e,lex_iv_2,local_258.fLocalForm,0);
  }
  StrX::~StrX(&local_258);
  errSeen = 1;
LAB_00103b11:
  iVar11 = 2;
  while (iVar10 = iVar11 + -1, iVar11 != 0) {
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_258,lex_v_ran_v_1);
    pvVar9 = (void *)0x2;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x35b,lex_v_ran_v_1);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      expValue.fValue.f_strVal = (XMLCh *)0x40934a449ba5e354;
      expValue._0_8_ = local_a0;
      expValue.fValue._8_8_ = local_48;
      expValue.fValue._16_8_ = uStack_40;
      expValue.fValue.f_datetime.f_milisec = (double)local_38;
      bVar3 = compareActualValue(dt_decimal,*pXVar4,expValue);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_258,lex_v_ran64_v_1);
    pvVar9 = (void *)0x2;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x35d,lex_v_ran64_v_1);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      expValue_00.fValue.f_strVal = (XMLCh *)0x43f0000000000000;
      expValue_00._0_8_ = local_c8;
      expValue_00.fValue._8_8_ = local_60;
      expValue_00.fValue._16_8_ = uStack_58;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_50;
      bVar3 = compareActualValue(dt_decimal,*pXVar4,expValue_00);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_258,lex_v_ran64_v_2);
    pvVar9 = (void *)0x2;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x35e,lex_v_ran64_v_2);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      expValue_01.fValue.f_strVal = (XMLCh *)0x408f3979ca10c924;
      expValue_01._0_8_ = local_f0;
      expValue_01.fValue._8_8_ = local_78;
      expValue_01.fValue._16_8_ = uStack_70;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_68;
      bVar3 = compareActualValue(dt_decimal,*pXVar4,expValue_01);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_258,lex_iv_1);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        pcVar1 = local_258.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x362,lex_iv_1,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      pvVar9 = (void *)0x362;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x362,lex_iv_1);
      StrX::~StrX(&local_258);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_258,lex_iv_2);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    iVar11 = iVar10;
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        pcVar1 = local_258.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x363,lex_iv_2,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      pvVar9 = (void *)0x363;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x363,lex_iv_2);
      StrX::~StrX(&local_258);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
  }
  iVar11 = 2;
LAB_00104079:
  iVar10 = iVar11 + -1;
  if (iVar11 == 0) {
    return;
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_258,data_rawstr_1);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_decimal,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x381,data_rawstr_1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_1);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x381,data_rawstr_1,local_258.fLocalForm,_myStatus,data_canrep_1);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_258,data_rawstr_2);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_decimal,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x382,data_rawstr_2);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_2);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x382,data_rawstr_2,local_258.fLocalForm,_myStatus,data_canrep_2);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_258,data_rawstr_3);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_decimal,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,899,data_rawstr_3);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_3);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,899,data_rawstr_3,local_258.fLocalForm,_myStatus,data_canrep_3);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_258,data_rawstr_4);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_decimal,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,900,data_rawstr_4);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_4);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,900,data_rawstr_4,local_258.fLocalForm,_myStatus,data_canrep_4);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_258,data_rawstr_5);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_decimal,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x385,data_rawstr_5);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_5);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x385,data_rawstr_5,local_258.fLocalForm,_myStatus,data_canrep_5);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_258,data_rawstr_6);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_decimal,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x386,data_rawstr_6);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_6);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x386,data_rawstr_6,local_258.fLocalForm,_myStatus,data_canrep_6);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_258,data_rawstr_7);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_decimal,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x387,data_rawstr_7);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_7);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x387,data_rawstr_7,local_258.fLocalForm,_myStatus,data_canrep_7);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_258,lex_v_ran64_v_1);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_decimal,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x389,lex_v_ran64_v_1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran64_v_1);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x389,lex_v_ran64_v_1,local_258.fLocalForm,_myStatus,lex_v_ran64_v_1);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_258,lex_v_ran64_v_2);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_decimal,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x38a,lex_v_ran64_v_2);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran64_v_2);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x38a,lex_v_ran64_v_2,local_258.fLocalForm,_myStatus,lex_v_ran64_v_2);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_258,lex_v_ran64_iv_1);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_decimal,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x38b,lex_v_ran64_iv_1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran64_iv_1);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x38b,lex_v_ran64_iv_1,local_258.fLocalForm,_myStatus,lex_v_ran64_iv_1);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_12 = st_Init;
  StrX::StrX(&local_258,lex_v_ran64_iv_2);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_decimal,&myStatus_12,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x38c,lex_v_ran64_iv_2);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran64_iv_2);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x38c,lex_v_ran64_iv_2,local_258.fLocalForm,_myStatus,lex_v_ran64_iv_2);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_iv_1);
  lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (lVar8 == 0) {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      pcVar1 = local_258.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x38d,lex_iv_1,pcVar1,"st_FOCA0002",pcVar6);
      StrX::~StrX(&local_258);
      goto LAB_00104d2d;
    }
  }
  else {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x38d,lex_iv_1);
    StrX::~StrX(&local_258);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_00104d2d:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_iv_2);
  lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_258.fUnicodeForm,dt_decimal,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  iVar11 = iVar10;
  if (lVar8 == 0) goto LAB_00104dc1;
  StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
  printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
         ,0x38e,lex_iv_2);
  StrX::~StrX(&local_258);
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
  goto LAB_00104e15;
LAB_00104dc1:
  if (myStatus != st_FOCA0002) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    pcVar1 = local_258.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x38e,lex_iv_2,pcVar1,"st_FOCA0002",pcVar6);
    StrX::~StrX(&local_258);
LAB_00104e15:
    errSeen = 1;
  }
  goto LAB_00104079;
}

Assistant:

void test_dt_decimal()
{
    const XSValue::DataType dt = XSValue::dt_decimal;
    bool  toValidate = true;

    const char lex_v_ran_v_1[]="  1234.567  \n";
    const char lex_v_ran64_v_1[]="18446744073709551615.999";
    const char lex_v_ran64_v_2[]="999.18446744073709551615";
    const char lex_v_ran64_iv_1[]="18446744073709551616.999";
    const char lex_v_ran64_iv_2[]="999.18446744073709551616";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234.56.789";

    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_double = (double)1234.567;
    XSValue::XSValue_Data act_v_ran64_v_1; act_v_ran64_v_1.fValue.f_double = (double)18446744073709551615.999;
    XSValue::XSValue_Data act_v_ran64_v_2; act_v_ran64_v_2.fValue.f_double = (double)999.18446744073709551615;
    //XSValue::XSValue_Data act_v_ran64_iv_1;="18446744073709551616.999";
    //XSValue::XSValue_Data act_v_ran64_iv_2;="999.18446744073709551616";

    XSValue::XSValue_Data act_v_ran32_v_1; act_v_ran32_v_1.fValue.f_double = (double)4294967295.999;
    XSValue::XSValue_Data act_v_ran32_v_2; act_v_ran32_v_2.fValue.f_double = (double)999.4294967295;
    //XSValue::XSValue_Data act_v_ran32_iv_1;="4294967296.999";
    //XSValue::XSValue_Data act_v_ran32_iv_2;="999.4294967296";

/***
 * 3.2.3.2 Canonical representation
 *
 * The canonical representation for decimal is defined by prohibiting certain options from the Lexical
 * representation (3.2.3.1). Specifically,
 * 1. the preceding optional "+" sign is prohibited.
 * 2. The decimal point is required.
 * 3. Leading and trailing zeroes are prohibited subject to the following:
 *       there must be at least one digit to the right and
 *       to the left of the decimal point which may be a zero.
 ***/

    const char data_rawstr_1[]="  -123.45  \n";
    const char data_canrep_1[]="-123.45";
    const char data_rawstr_2[]="+123.45";
    const char data_canrep_2[]="123.45";
    const char data_rawstr_3[]="12345";
    const char data_canrep_3[]="12345.0";
    const char data_rawstr_4[]="000123.45";
    const char data_canrep_4[]="123.45";
    const char data_rawstr_5[]="123.45000";
    const char data_canrep_5[]="123.45";
    const char data_rawstr_6[]="00.12345";
    const char data_canrep_6[]="0.12345";
    const char data_rawstr_7[]="123.00";
    const char data_canrep_7[]="123.0";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid       n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_ran_v_1    , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_1,    dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);

        ACTVALUE_TEST(lex_v_ran64_v_1 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_1);
        ACTVALUE_TEST(lex_v_ran64_v_2 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_2);
        //ACTVALUE_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0001);
        //ACTVALUE_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0001);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    DONT_CARE);
        CANREP_TEST(data_rawstr_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_3,    DONT_CARE);
        CANREP_TEST(data_rawstr_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_4,    DONT_CARE);
        CANREP_TEST(data_rawstr_5,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_5,    DONT_CARE);
        CANREP_TEST(data_rawstr_6,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_6,    DONT_CARE);
        CANREP_TEST(data_rawstr_7,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_7,    DONT_CARE);

        CANREP_TEST(lex_v_ran64_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_1,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_2,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_1, DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_2, DONT_CARE);
        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,                XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,                XSValue::st_FOCA0002);

    }

}